

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ProtocVersionString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,int version)

{
  size_t sVar1;
  char buffer [128];
  char acStack_98 [127];
  undefined1 local_19;
  
  snprintf(acStack_98,0x80,"%d.%d",(ulong)(uint)(((int)this / 1000) % 1000),
           (ulong)(uint)((int)this % 1000));
  local_19 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_98,acStack_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ProtocVersionString(int version) {
  int minor = (version / 1000) % 1000;
  int micro = version % 1000;

  // 128 bytes should always be enough, but we use snprintf() anyway to be
  // safe.
  char buffer[128];
  snprintf(buffer, sizeof(buffer), "%d.%d", minor, micro);

  // Guard against broken MSVC snprintf().
  buffer[sizeof(buffer) - 1] = '\0';

  return buffer;
}